

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

void Curl_tcpnodelay(connectdata *conn,curl_socket_t sockfd)

{
  Curl_easy *data_00;
  connectdata *conn_00;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  undefined4 local_24;
  int level;
  curl_socklen_t onoff;
  Curl_easy *data;
  connectdata *pcStack_10;
  curl_socket_t sockfd_local;
  connectdata *conn_local;
  
  _level = conn->data;
  local_24 = 1;
  data._4_4_ = sockfd;
  pcStack_10 = conn;
  iVar1 = setsockopt(sockfd,6,1,&local_24,4);
  conn_00 = pcStack_10;
  data_00 = _level;
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    pcVar3 = Curl_strerror(conn_00,*piVar2);
    Curl_infof(data_00,"Could not set TCP_NODELAY: %s\n",pcVar3);
  }
  else {
    Curl_infof(_level,"TCP_NODELAY set\n");
  }
  return;
}

Assistant:

void Curl_tcpnodelay(struct connectdata *conn, curl_socket_t sockfd)
{
#if defined(TCP_NODELAY)
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
  struct Curl_easy *data = conn->data;
#endif
  curl_socklen_t onoff = (curl_socklen_t) 1;
  int level = IPPROTO_TCP;

#if defined(CURL_DISABLE_VERBOSE_STRINGS)
  (void) conn;
#endif

  if(setsockopt(sockfd, level, TCP_NODELAY, (void *)&onoff,
                sizeof(onoff)) < 0)
    infof(data, "Could not set TCP_NODELAY: %s\n",
          Curl_strerror(conn, SOCKERRNO));
  else
    infof(data, "TCP_NODELAY set\n");
#else
  (void)conn;
  (void)sockfd;
#endif
}